

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O0

UINT32 NES_APU_np_Render(void *chip,INT32 *b)

{
  UINT32 clocks_00;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 local_3c;
  undefined4 local_38;
  INT32 voltage;
  INT32 ref;
  INT32 m [2];
  UINT32 clocks;
  NES_APU *apu;
  INT32 *b_local;
  void *chip_local;
  
  RC_STEP((RATIO_CNTR *)((long)chip + 0x168));
  clocks_00 = RC_GET_VAL((RATIO_CNTR *)((long)chip + 0x168));
  RC_MASK((RATIO_CNTR *)((long)chip + 0x168));
  Tick((NES_APU *)chip,clocks_00);
  if ((*(uint *)((long)chip + 0x1c) & 1) == 0) {
    local_38 = *(undefined4 *)((long)chip + 0x54);
  }
  else {
    local_38 = 0;
  }
  *(undefined4 *)((long)chip + 0x54) = local_38;
  if ((*(uint *)((long)chip + 0x1c) & 2) == 0) {
    local_3c = *(undefined4 *)((long)chip + 0x58);
  }
  else {
    local_3c = 0;
  }
  *(undefined4 *)((long)chip + 0x58) = local_3c;
  if (*(int *)((long)chip + 0xc) == 0) {
    ref = (*(int *)((long)chip + 0x58) * *(int *)((long)chip + 0xe4)) / 0xf;
    voltage = (*(int *)((long)chip + 0x54) * *(int *)((long)chip + 0xe4)) / 0xf;
  }
  else {
    voltage = *(int *)((long)chip +
                      (long)(*(int *)((long)chip + 0x54) + *(int *)((long)chip + 0x58)) * 4 + 100);
    iVar1 = *(int *)((long)chip + 0x54) * 0x40;
    iVar2 = *(int *)((long)chip + 0x58) * 0x40;
    iVar3 = iVar1 + iVar2;
    ref = voltage;
    if (0 < iVar3) {
      ref = (iVar2 * voltage) / iVar3;
      voltage = (iVar1 * voltage) / iVar3;
    }
  }
  *b = voltage * *(int *)((long)chip + 0x20);
  *b = ref * *(int *)((long)chip + 0x24) + *b;
  *b = *b >> 5;
  b[1] = voltage * *(int *)((long)chip + 0x28);
  b[1] = ref * *(int *)((long)chip + 0x2c) + b[1];
  b[1] = b[1] >> 5;
  return 2;
}

Assistant:

UINT32 NES_APU_np_Render(void* chip, INT32 b[2])
{
	NES_APU* apu = (NES_APU*)chip;
	UINT32 clocks;
	INT32 m[2];

	RC_STEP(&apu->tick_count);
	clocks = RC_GET_VAL(&apu->tick_count);
	RC_MASK(&apu->tick_count);
	Tick(apu, clocks);

	apu->out[0] = (apu->mask & 1) ? 0 : apu->out[0];
	apu->out[1] = (apu->mask & 2) ? 0 : apu->out[1];

	if(apu->option[OPT_NONLINEAR_MIXER])
	{
		INT32 ref;
		INT32 voltage = apu->square_table[apu->out[0] + apu->out[1]];
		m[0] = apu->out[0] << 6;
		m[1] = apu->out[1] << 6;
		ref = m[0] + m[1];
		if (ref > 0)
		{
			m[0] = (m[0] * voltage) / ref;
			m[1] = (m[1] * voltage) / ref;
		}
		else
		{
			m[0] = voltage;
			m[1] = voltage;
		}
	}
	else
	{
		m[0] = (apu->out[0] * apu->square_linear) / 15;
		m[1] = (apu->out[1] * apu->square_linear) / 15;
	}

	// Shifting is (x-2) to match the volume of MAME's NES APU sound core
	b[0]  = m[0] * apu->sm[0][0];
	b[0] += m[1] * apu->sm[0][1];
	b[0] >>= 7-2;	// was 7, but is now 8 for bipolar square

	b[1]  = m[0] * apu->sm[1][0];
	b[1] += m[1] * apu->sm[1][1];
	b[1] >>= 7-2;	// see above

	return 2;
}